

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,LIndex jaohI,Index t,Index *jaIs,Index *joIs)

{
  pointer puVar1;
  unsigned_long_long uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Index IVar5;
  size_t nrO;
  size_t nrA;
  ulong i;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar12 [64];
  undefined1 in_XMM2 [16];
  undefined1 auVar11 [64];
  undefined1 extraout_var_00 [56];
  
  uVar10 = (ulong)t;
  puVar1 = (this->_m_firstJAOHIforT).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar10 < (ulong)((long)(this->_m_firstJAOHIforT).
                             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    uVar2 = puVar1[uVar10];
    nrO = (**(code **)((long)*this->_m_madp + 200))();
    nrA = (**(code **)((long)*this->_m_madp + 0x68))();
    auVar11._8_56_ = extraout_var;
    auVar11._0_8_ = extraout_XMM0_Qa;
    if (t != 0) {
      uVar9 = jaohI - uVar2;
      auVar4 = vcvtusi2sd_avx512f(auVar11._0_16_,nrA * nrO);
      iVar8 = t - 1;
      uVar7 = 0;
      do {
        auVar3 = vcvtusi2sd_avx512f(in_XMM2,iVar8);
        auVar12._0_8_ = pow(auVar4._0_8_,auVar3._0_8_);
        auVar12._8_56_ = extraout_var_00;
        uVar6 = vcvttsd2usi_avx512f(auVar12._0_16_);
        i = uVar9 / uVar6;
        uVar9 = uVar9 % uVar6;
        IVar5 = Globals::CastLIndexToIndex(i);
        IVar5 = IndexTools::ActionObservation_to_ActionIndex(IVar5,nrA,nrO);
        jaIs[uVar7] = IVar5;
        IVar5 = Globals::CastLIndexToIndex(i);
        IVar5 = IndexTools::ActionObservation_to_ObservationIndex(IVar5,nrA,nrO);
        joIs[uVar7] = IVar5;
        uVar7 = uVar7 + 1;
        iVar8 = iVar8 + -1;
      } while (uVar10 != uVar7);
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryArrays
    (LIndex jaohI, Index t,  Index jaIs[], Index joIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    LIndex jaohIwithinThisT = jaohI - _m_firstJAOHIforT.at(t);
   
    LIndex remainder = jaohIwithinThisT;
    size_t vec_size = t; // the number of 'JAO' we are searching
        //note: this was t+1, but that is incorrect(?)!
        
    size_t nrJO = GetNrJointObservations();
    size_t nrJA = GetNrJointActions();
    size_t nrJAO = nrJO*nrJA;
//    Index jao_array[vec_size];
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // suppose we have a jaoh = < jaoI[3], jaoI[2], jao[1], jaoI[0] >
        // (the numbers represent the stage of the jaoI)
        // ->then this history is for stage 4 (we have that t=4).
        //
        // the jaohI is generated by: 
        //      jaohI= jaoI[3] * nrJAO^3 + ... +jaoI[0] * nrJAO^0
        //
        // we reconstruct this by performing
        // jaoI[3] = jaohI /  nrJAO^3
        // remainder = jaohI - (jaoI^3)
        // jaoI[2] = remainder / nrJAO^2
        // etc.
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrJAO, (double)(stage));

        LIndex jaoI_t2 = remainder / b;
//        jao_array[t2] = jaoI_t2;
        remainder -= jaoI_t2 * b;

        jaIs[t2] = IndexTools::
            ActionObservation_to_ActionIndex(CastLIndexToIndex(jaoI_t2), nrJA, nrJO);
        joIs[t2] = IndexTools::
            ActionObservation_to_ObservationIndex(CastLIndexToIndex(jaoI_t2), nrJA, nrJO);
    }

}